

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void boost::unordered::detail::foa::
     table_arrays<slang::SVInt,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
     ::delete_(allocator_type al,
              table_arrays<slang::SVInt,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
              *arrays)

{
  value_type *pvVar1;
  StackAllocator<slang::SVInt,_128UL,_16UL> *__a;
  long in_RSI;
  allocator_type sal;
  pointer __p;
  
  pvVar1 = elements((table_arrays<slang::SVInt,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                     *)0x6b47a2);
  if (pvVar1 != (value_type *)0x0) {
    __p = *(pointer *)(in_RSI + 0x18);
    __a = (StackAllocator<slang::SVInt,_128UL,_16UL> *)buffer_size(*(long *)(in_RSI + 8) + 1);
    std::allocator_traits<slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>::
    deallocate(__a,__p,0x6b47db);
  }
  return;
}

Assistant:

static void delete_(allocator_type al, table_arrays& arrays) noexcept {
        using storage_traits = std::allocator_traits<allocator_type>;

        auto sal = allocator_type(al);
        if (arrays.elements()) {
            storage_traits::deallocate(sal, arrays.elements_,
                                       buffer_size(arrays.groups_size_mask + 1));
        }
    }